

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O3

void __thiscall
YacclabTests::YacclabTests
          (YacclabTests *this,ModeConfig *mode_cfg,GlobalConfig *glob_cfg,error_code *ec)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  path *ppVar4;
  string local_50;
  
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  OutputBox::OutputBox(&this->ob_,&local_50,0x50,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->ec_ = ec;
  this->mode_cfg_ = mode_cfg;
  this->glob_cfg_ = glob_cfg;
  pcVar3 = (glob_cfg->glob_output_path).path_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (glob_cfg->glob_output_path).path_._M_string_length
            );
  ppVar4 = filesystem::path::operator/=((path *)&local_50,&mode_cfg->mode_output_path);
  (this->output_path).path_._M_dataplus._M_p = (pointer)&(this->output_path).path_.field_2;
  pcVar3 = (ppVar4->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->output_path,pcVar3,pcVar3 + (ppVar4->path_)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cv::Mat::Mat(&(this->average_results_).super_Mat);
  *(uint *)&this->average_results_ = *(uint *)&this->average_results_ & 0xfffff000 | 6;
  cv::Mat::Mat(&(this->density_results_).super_Mat);
  *(uint *)&this->density_results_ = *(uint *)&this->density_results_ & 0xfffff000 | 6;
  p_Var1 = &(this->granularity_results_)._M_t._M_impl.super__Rb_tree_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

YacclabTests(ModeConfig &mode_cfg, GlobalConfig &glob_cfg, std::error_code &ec) : 
		ec_(ec), mode_cfg_(mode_cfg), glob_cfg_(glob_cfg), output_path(glob_cfg.glob_output_path / mode_cfg.mode_output_path) {}